

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::lexIntegerSuffix(Lexer *this,int suffixCnt)

{
  uchar uVar1;
  int suffixCnt_local;
  Lexer *this_local;
  
  if (suffixCnt != 0) {
    uVar1 = this->yychar_;
    if (uVar1 == 'L') {
      yyinput(this);
      if (this->yychar_ == 'L') {
        yyinput(this);
      }
      if ((this->yychar_ | 0x20) == 0x75) {
        lexIntegerSuffix(this,suffixCnt + -1);
      }
    }
    else {
      if (uVar1 != 'U') {
        if (uVar1 == 'l') {
          yyinput(this);
          if (this->yychar_ == 'l') {
            yyinput(this);
          }
          if ((this->yychar_ | 0x20) != 0x75) {
            return;
          }
          lexIntegerSuffix(this,suffixCnt + -1);
          return;
        }
        if (uVar1 != 'u') {
          return;
        }
      }
      yyinput(this);
      if ((this->yychar_ | 0x20) == 0x6c) {
        lexIntegerSuffix(this,suffixCnt + -1);
      }
    }
  }
  return;
}

Assistant:

void Lexer::lexIntegerSuffix(int suffixCnt)
{
    if (!suffixCnt)
        return;

    switch(yychar_) {
        case 'u':
        case 'U':
            yyinput();
            switch (yychar_) {
                case 'l':
                case 'L':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'l':
            yyinput();
            if (yychar_ == 'l')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'L':
            yyinput();
            if (yychar_ == 'L')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;
    }
}